

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::utf8_converter_impl::~utf8_converter_impl(utf8_converter_impl *this)

{
  pointer pcVar1;
  
  *(undefined ***)&this->super_converter<char> = &PTR__utf8_converter_impl_001d1e30;
  ucasemap_close_70((this->map_).map_);
  pcVar1 = (this->locale_id_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->locale_id_).field_2) {
    operator_delete(pcVar1);
  }
  std::locale::facet::~facet((facet *)this);
  operator_delete(this);
  return;
}

Assistant:

utf8_converter_impl(cdata const &d) :
            locale_id_(d.locale.getName()),
            map_(locale_id_)
        {
        }